

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Immovable * __thiscall
kj::_::NullableValue<kj::(anonymous_namespace)::Immovable>::emplace<>
          (NullableValue<kj::(anonymous_namespace)::Immovable> *this)

{
  NullableValue<kj::(anonymous_namespace)::Immovable> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::(anonymous_namespace)::Immovable>((Immovable *)&this->field_0x1);
  }
  ctor<kj::(anonymous_namespace)::Immovable>((Immovable *)&this->field_0x1);
  this->isSet = true;
  return (Immovable *)&this->field_0x1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }